

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
               (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                begin,__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                      end,int param_3,uint param_4)

{
  double dVar1;
  int iVar2;
  HighsBoundType HVar3;
  undefined8 uVar4;
  HighsInt HVar5;
  HighsBoundType HVar6;
  HighsInt HVar7;
  bool bVar8;
  long lVar9;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  _Var10;
  ulong uVar11;
  ulong uVar12;
  HighsDomainChange *pHVar13;
  ulong uVar14;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  _Var15;
  long lVar16;
  HighsDomainChange *pHVar17;
  HighsDomainChange *pHVar18;
  HighsDomainChange *pHVar19;
  HighsDomainChange *pHVar20;
  long lVar21;
  HighsDomainChange *pHVar22;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  pVar23;
  _Iter_comp_iter<std::less<HighsDomainChange>_> __cmp;
  double local_68;
  undefined8 uStack_60;
  int local_50;
  uint local_4c;
  HighsDomainChange *local_48;
  HighsDomainChange *local_40;
  HighsDomainChange *local_38;
  
  pHVar22 = end._M_current + -1;
  local_40 = end._M_current + -2;
  local_48 = end._M_current + -3;
  local_50 = param_3;
  local_38 = pHVar22;
  do {
    uVar12 = (long)end._M_current - (long)begin._M_current >> 4;
    if ((long)uVar12 < 0x18) {
      pHVar17 = begin._M_current + 1;
      bVar8 = pHVar17 == end._M_current || begin._M_current == end._M_current;
      if ((param_4 & 1) == 0) {
        _Var10._M_current = begin._M_current;
        if (bVar8) goto LAB_002aadf2;
        do {
          iVar2 = _Var10._M_current[1].column;
          if (iVar2 < (_Var10._M_current)->column) {
LAB_002aa64c:
            dVar1 = pHVar17->boundval;
            HVar3 = _Var10._M_current[1].boundtype;
            do {
              do {
                pHVar19 = _Var10._M_current;
                HVar5 = pHVar19->column;
                HVar6 = pHVar19->boundtype;
                pHVar19[1].boundval = pHVar19->boundval;
                pHVar19[1].column = HVar5;
                pHVar19[1].boundtype = HVar6;
                _Var10._M_current = pHVar19 + -1;
              } while (iVar2 < pHVar19[-1].column);
            } while ((iVar2 <= pHVar19[-1].column) &&
                    (((int)HVar3 < (int)pHVar19[-1].boundtype ||
                     (((int)HVar3 <= (int)pHVar19[-1].boundtype &&
                      (dVar1 < (_Var10._M_current)->boundval))))));
            pHVar19->boundval = dVar1;
            pHVar19->column = iVar2;
            pHVar19->boundtype = HVar3;
          }
          else if (iVar2 <= (_Var10._M_current)->column) {
            if (((int)_Var10._M_current[1].boundtype < (int)(_Var10._M_current)->boundtype) ||
               (((int)_Var10._M_current[1].boundtype <= (int)(_Var10._M_current)->boundtype &&
                (pHVar17->boundval <= (_Var10._M_current)->boundval &&
                 (_Var10._M_current)->boundval != pHVar17->boundval)))) goto LAB_002aa64c;
          }
          pHVar19 = pHVar17 + 1;
          _Var10._M_current = pHVar17;
          pHVar17 = pHVar19;
        } while (pHVar19 != end._M_current);
      }
      else {
        if (bVar8) goto LAB_002aadf2;
        lVar9 = 0;
        _Var10._M_current = begin._M_current;
        do {
          iVar2 = _Var10._M_current[1].column;
          if (iVar2 < (_Var10._M_current)->column) {
LAB_002aa535:
            dVar1 = _Var10._M_current[1].boundval;
            HVar3 = _Var10._M_current[1].boundtype;
            pHVar19 = pHVar17 + -1;
            HVar5 = (_Var10._M_current)->column;
            HVar6 = (_Var10._M_current)->boundtype;
            pHVar17->boundval = (_Var10._M_current)->boundval;
            pHVar17->column = HVar5;
            pHVar17->boundtype = HVar6;
            pHVar20 = pHVar17;
            lVar21 = lVar9;
            if (pHVar19 != begin._M_current) {
              do {
                pHVar13 = pHVar19;
                pHVar18 = pHVar13 + -1;
                if (pHVar13[-1].column <= iVar2) {
                  pHVar19 = pHVar13;
                  if (pHVar13[-1].column < iVar2) {
                    pHVar20 = pHVar13 + 1;
                    break;
                  }
                  if (((int)pHVar13[-1].boundtype <= (int)HVar3) &&
                     (((int)pHVar13[-1].boundtype < (int)HVar3 || (pHVar18->boundval <= dVar1))))
                  break;
                }
                HVar5 = pHVar13[-1].column;
                HVar6 = pHVar13[-1].boundtype;
                pHVar13->boundval = pHVar18->boundval;
                pHVar13->column = HVar5;
                pHVar13->boundtype = HVar6;
                lVar21 = lVar21 + 0x10;
                pHVar19 = pHVar18;
                pHVar20 = pHVar13;
              } while (lVar21 != 0);
            }
            pHVar19->boundval = dVar1;
            pHVar20[-1].column = iVar2;
            pHVar20[-1].boundtype = HVar3;
          }
          else if (iVar2 <= (_Var10._M_current)->column) {
            if (((int)_Var10._M_current[1].boundtype < (int)(_Var10._M_current)->boundtype) ||
               (((int)_Var10._M_current[1].boundtype <= (int)(_Var10._M_current)->boundtype &&
                (pHVar17->boundval <= (_Var10._M_current)->boundval &&
                 (_Var10._M_current)->boundval != pHVar17->boundval)))) goto LAB_002aa535;
          }
          pHVar19 = pHVar17 + 1;
          lVar9 = lVar9 + -0x10;
          _Var10._M_current = pHVar17;
          pHVar17 = pHVar19;
        } while (pHVar19 != end._M_current);
      }
LAB_002aa5e0:
      bVar8 = true;
    }
    else {
      uVar11 = uVar12 >> 1;
      pHVar17 = begin._M_current + uVar11;
      if ((long)uVar12 < 0x81) {
        if ((begin._M_current)->column < pHVar17->column) {
LAB_002aa6c8:
          local_68 = pHVar17->boundval;
          uStack_60._0_4_ = pHVar17->column;
          uStack_60._4_4_ = pHVar17->boundtype;
          HVar5 = (begin._M_current)->column;
          HVar3 = (begin._M_current)->boundtype;
          pHVar17->boundval = (begin._M_current)->boundval;
          pHVar17->column = HVar5;
          pHVar17->boundtype = HVar3;
          (begin._M_current)->boundval = local_68;
          (begin._M_current)->column = (undefined4)uStack_60;
          (begin._M_current)->boundtype = uStack_60._4_4_;
        }
        else if ((begin._M_current)->column <= pHVar17->column) {
          if (((int)(begin._M_current)->boundtype < (int)pHVar17->boundtype) ||
             (((int)(begin._M_current)->boundtype <= (int)pHVar17->boundtype &&
              ((begin._M_current)->boundval <= pHVar17->boundval &&
               pHVar17->boundval != (begin._M_current)->boundval)))) goto LAB_002aa6c8;
        }
        if (end._M_current[-1].column < (begin._M_current)->column) {
LAB_002aa722:
          local_68 = (begin._M_current)->boundval;
          uStack_60._0_4_ = (begin._M_current)->column;
          uStack_60._4_4_ = (begin._M_current)->boundtype;
          HVar5 = pHVar22->column;
          HVar3 = pHVar22->boundtype;
          (begin._M_current)->boundval = pHVar22->boundval;
          (begin._M_current)->column = HVar5;
          (begin._M_current)->boundtype = HVar3;
          pHVar22->boundval = local_68;
          pHVar22->column = (undefined4)uStack_60;
          pHVar22->boundtype = uStack_60._4_4_;
        }
        else if (end._M_current[-1].column <= (begin._M_current)->column) {
          if (((int)end._M_current[-1].boundtype < (int)(begin._M_current)->boundtype) ||
             (((int)end._M_current[-1].boundtype <= (int)(begin._M_current)->boundtype &&
              (pHVar22->boundval <= (begin._M_current)->boundval &&
               (begin._M_current)->boundval != pHVar22->boundval)))) goto LAB_002aa722;
        }
        if ((begin._M_current)->column < pHVar17->column) {
LAB_002aa780:
          local_68 = pHVar17->boundval;
          uStack_60._0_4_ = pHVar17->column;
          uStack_60._4_4_ = pHVar17->boundtype;
          HVar5 = (begin._M_current)->column;
          HVar3 = (begin._M_current)->boundtype;
          pHVar17->boundval = (begin._M_current)->boundval;
          pHVar17->column = HVar5;
          pHVar17->boundtype = HVar3;
          (begin._M_current)->boundval = local_68;
          (begin._M_current)->column = (undefined4)uStack_60;
          (begin._M_current)->boundtype = uStack_60._4_4_;
        }
        else if ((begin._M_current)->column <= pHVar17->column) {
          if (((int)(begin._M_current)->boundtype < (int)pHVar17->boundtype) ||
             (((int)(begin._M_current)->boundtype <= (int)pHVar17->boundtype &&
              ((begin._M_current)->boundval <= pHVar17->boundval &&
               pHVar17->boundval != (begin._M_current)->boundval)))) goto LAB_002aa780;
        }
      }
      else {
        if (pHVar17->column < (begin._M_current)->column) {
LAB_002aa612:
          dVar1 = (begin._M_current)->boundval;
          HVar7 = (begin._M_current)->column;
          HVar6 = (begin._M_current)->boundtype;
          HVar5 = pHVar17->column;
          HVar3 = pHVar17->boundtype;
          (begin._M_current)->boundval = pHVar17->boundval;
          (begin._M_current)->column = HVar5;
          (begin._M_current)->boundtype = HVar3;
          pHVar17->boundval = dVar1;
          pHVar17->column = HVar7;
          pHVar17->boundtype = HVar6;
        }
        else if (pHVar17->column <= (begin._M_current)->column) {
          if (((int)pHVar17->boundtype < (int)(begin._M_current)->boundtype) ||
             (((int)pHVar17->boundtype <= (int)(begin._M_current)->boundtype &&
              (pHVar17->boundval <= (begin._M_current)->boundval &&
               (begin._M_current)->boundval != pHVar17->boundval)))) goto LAB_002aa612;
        }
        if (end._M_current[-1].column < pHVar17->column) {
LAB_002aa6f5:
          dVar1 = pHVar17->boundval;
          HVar7 = pHVar17->column;
          HVar6 = pHVar17->boundtype;
          HVar5 = pHVar22->column;
          HVar3 = pHVar22->boundtype;
          pHVar17->boundval = pHVar22->boundval;
          pHVar17->column = HVar5;
          pHVar17->boundtype = HVar3;
          pHVar22->boundval = dVar1;
          pHVar22->column = HVar7;
          pHVar22->boundtype = HVar6;
        }
        else if (end._M_current[-1].column <= pHVar17->column) {
          if (((int)end._M_current[-1].boundtype < (int)pHVar17->boundtype) ||
             (((int)end._M_current[-1].boundtype <= (int)pHVar17->boundtype &&
              (pHVar22->boundval <= pHVar17->boundval && pHVar17->boundval != pHVar22->boundval))))
          goto LAB_002aa6f5;
        }
        if (pHVar17->column < (begin._M_current)->column) {
LAB_002aa752:
          dVar1 = (begin._M_current)->boundval;
          HVar7 = (begin._M_current)->column;
          HVar6 = (begin._M_current)->boundtype;
          HVar5 = pHVar17->column;
          HVar3 = pHVar17->boundtype;
          (begin._M_current)->boundval = pHVar17->boundval;
          (begin._M_current)->column = HVar5;
          (begin._M_current)->boundtype = HVar3;
          pHVar17->boundval = dVar1;
          pHVar17->column = HVar7;
          pHVar17->boundtype = HVar6;
        }
        else if (pHVar17->column <= (begin._M_current)->column) {
          if (((int)pHVar17->boundtype < (int)(begin._M_current)->boundtype) ||
             (((int)pHVar17->boundtype <= (int)(begin._M_current)->boundtype &&
              (pHVar17->boundval <= (begin._M_current)->boundval &&
               (begin._M_current)->boundval != pHVar17->boundval)))) goto LAB_002aa752;
        }
        pHVar19 = begin._M_current + 1;
        pHVar20 = begin._M_current + (uVar11 - 1);
        if (begin._M_current[uVar11 - 1].column < begin._M_current[1].column) {
LAB_002aa7bf:
          dVar1 = pHVar19->boundval;
          HVar7 = begin._M_current[1].column;
          HVar6 = begin._M_current[1].boundtype;
          HVar5 = begin._M_current[uVar11 - 1].column;
          HVar3 = begin._M_current[uVar11 - 1].boundtype;
          pHVar19->boundval = pHVar20->boundval;
          begin._M_current[1].column = HVar5;
          begin._M_current[1].boundtype = HVar3;
          pHVar20->boundval = dVar1;
          begin._M_current[uVar11 - 1].column = HVar7;
          begin._M_current[uVar11 - 1].boundtype = HVar6;
        }
        else if (begin._M_current[uVar11 - 1].column <= begin._M_current[1].column) {
          if (((int)begin._M_current[uVar11 - 1].boundtype < (int)begin._M_current[1].boundtype) ||
             (((int)begin._M_current[uVar11 - 1].boundtype <= (int)begin._M_current[1].boundtype &&
              (pHVar20->boundval <= pHVar19->boundval && pHVar19->boundval != pHVar20->boundval))))
          goto LAB_002aa7bf;
        }
        if (end._M_current[-2].column < begin._M_current[uVar11 - 1].column) {
LAB_002aa813:
          dVar1 = pHVar20->boundval;
          HVar7 = begin._M_current[uVar11 - 1].column;
          HVar6 = begin._M_current[uVar11 - 1].boundtype;
          HVar5 = local_40->column;
          HVar3 = local_40->boundtype;
          pHVar20->boundval = local_40->boundval;
          begin._M_current[uVar11 - 1].column = HVar5;
          begin._M_current[uVar11 - 1].boundtype = HVar3;
          local_40->boundval = dVar1;
          local_40->column = HVar7;
          local_40->boundtype = HVar6;
        }
        else if (end._M_current[-2].column <= begin._M_current[uVar11 - 1].column) {
          if (((int)end._M_current[-2].boundtype < (int)begin._M_current[uVar11 - 1].boundtype) ||
             (((int)end._M_current[-2].boundtype <= (int)begin._M_current[uVar11 - 1].boundtype &&
              (local_40->boundval <= pHVar20->boundval && pHVar20->boundval != local_40->boundval)))
             ) goto LAB_002aa813;
        }
        if (begin._M_current[uVar11 - 1].column < begin._M_current[1].column) {
LAB_002aa843:
          dVar1 = pHVar19->boundval;
          HVar7 = begin._M_current[1].column;
          HVar6 = begin._M_current[1].boundtype;
          HVar5 = begin._M_current[uVar11 - 1].column;
          HVar3 = begin._M_current[uVar11 - 1].boundtype;
          pHVar19->boundval = pHVar20->boundval;
          begin._M_current[1].column = HVar5;
          begin._M_current[1].boundtype = HVar3;
          pHVar20->boundval = dVar1;
          begin._M_current[uVar11 - 1].column = HVar7;
          begin._M_current[uVar11 - 1].boundtype = HVar6;
        }
        else if (begin._M_current[uVar11 - 1].column <= begin._M_current[1].column) {
          if (((int)begin._M_current[uVar11 - 1].boundtype < (int)begin._M_current[1].boundtype) ||
             (((int)begin._M_current[uVar11 - 1].boundtype <= (int)begin._M_current[1].boundtype &&
              (pHVar20->boundval <= pHVar19->boundval && pHVar19->boundval != pHVar20->boundval))))
          goto LAB_002aa843;
        }
        pHVar19 = begin._M_current + 2;
        pHVar13 = begin._M_current + uVar11 + 1;
        if (begin._M_current[uVar11 + 1].column < begin._M_current[2].column) {
LAB_002aa87a:
          dVar1 = pHVar19->boundval;
          HVar7 = begin._M_current[2].column;
          HVar6 = begin._M_current[2].boundtype;
          HVar5 = begin._M_current[uVar11 + 1].column;
          HVar3 = begin._M_current[uVar11 + 1].boundtype;
          pHVar19->boundval = pHVar13->boundval;
          begin._M_current[2].column = HVar5;
          begin._M_current[2].boundtype = HVar3;
          pHVar13->boundval = dVar1;
          begin._M_current[uVar11 + 1].column = HVar7;
          begin._M_current[uVar11 + 1].boundtype = HVar6;
        }
        else if (begin._M_current[uVar11 + 1].column <= begin._M_current[2].column) {
          if (((int)begin._M_current[uVar11 + 1].boundtype < (int)begin._M_current[2].boundtype) ||
             (((int)begin._M_current[uVar11 + 1].boundtype <= (int)begin._M_current[2].boundtype &&
              (pHVar13->boundval <= pHVar19->boundval && pHVar19->boundval != pHVar13->boundval))))
          goto LAB_002aa87a;
        }
        if (end._M_current[-3].column < begin._M_current[uVar11 + 1].column) {
LAB_002aa8a5:
          dVar1 = pHVar13->boundval;
          HVar7 = begin._M_current[uVar11 + 1].column;
          HVar6 = begin._M_current[uVar11 + 1].boundtype;
          HVar5 = local_48->column;
          HVar3 = local_48->boundtype;
          pHVar13->boundval = local_48->boundval;
          begin._M_current[uVar11 + 1].column = HVar5;
          begin._M_current[uVar11 + 1].boundtype = HVar3;
          local_48->boundval = dVar1;
          local_48->column = HVar7;
          local_48->boundtype = HVar6;
        }
        else if (end._M_current[-3].column <= begin._M_current[uVar11 + 1].column) {
          if (((int)end._M_current[-3].boundtype < (int)begin._M_current[uVar11 + 1].boundtype) ||
             (((int)end._M_current[-3].boundtype <= (int)begin._M_current[uVar11 + 1].boundtype &&
              (local_48->boundval <= pHVar13->boundval && pHVar13->boundval != local_48->boundval)))
             ) goto LAB_002aa8a5;
        }
        if (begin._M_current[uVar11 + 1].column < begin._M_current[2].column) {
LAB_002aa8d5:
          dVar1 = pHVar19->boundval;
          HVar7 = begin._M_current[2].column;
          HVar6 = begin._M_current[2].boundtype;
          HVar5 = begin._M_current[uVar11 + 1].column;
          HVar3 = begin._M_current[uVar11 + 1].boundtype;
          pHVar19->boundval = pHVar13->boundval;
          begin._M_current[2].column = HVar5;
          begin._M_current[2].boundtype = HVar3;
          pHVar13->boundval = dVar1;
          begin._M_current[uVar11 + 1].column = HVar7;
          begin._M_current[uVar11 + 1].boundtype = HVar6;
        }
        else if (begin._M_current[uVar11 + 1].column <= begin._M_current[2].column) {
          if (((int)begin._M_current[uVar11 + 1].boundtype < (int)begin._M_current[2].boundtype) ||
             (((int)begin._M_current[uVar11 + 1].boundtype <= (int)begin._M_current[2].boundtype &&
              (pHVar13->boundval <= pHVar19->boundval && pHVar19->boundval != pHVar13->boundval))))
          goto LAB_002aa8d5;
        }
        if (pHVar17->column < begin._M_current[uVar11 - 1].column) {
LAB_002aa8fd:
          dVar1 = pHVar20->boundval;
          HVar7 = begin._M_current[uVar11 - 1].column;
          HVar6 = begin._M_current[uVar11 - 1].boundtype;
          HVar5 = pHVar17->column;
          HVar3 = pHVar17->boundtype;
          pHVar20->boundval = pHVar17->boundval;
          begin._M_current[uVar11 - 1].column = HVar5;
          begin._M_current[uVar11 - 1].boundtype = HVar3;
          pHVar17->boundval = dVar1;
          pHVar17->column = HVar7;
          pHVar17->boundtype = HVar6;
        }
        else if (pHVar17->column <= begin._M_current[uVar11 - 1].column) {
          if (((int)pHVar17->boundtype < (int)begin._M_current[uVar11 - 1].boundtype) ||
             (((int)pHVar17->boundtype <= (int)begin._M_current[uVar11 - 1].boundtype &&
              (pHVar17->boundval <= pHVar20->boundval && pHVar20->boundval != pHVar17->boundval))))
          goto LAB_002aa8fd;
        }
        if (begin._M_current[uVar11 + 1].column < pHVar17->column) {
LAB_002aa925:
          dVar1 = pHVar17->boundval;
          HVar7 = pHVar17->column;
          HVar6 = pHVar17->boundtype;
          HVar5 = begin._M_current[uVar11 + 1].column;
          HVar3 = begin._M_current[uVar11 + 1].boundtype;
          pHVar17->boundval = pHVar13->boundval;
          pHVar17->column = HVar5;
          pHVar17->boundtype = HVar3;
          pHVar13->boundval = dVar1;
          begin._M_current[uVar11 + 1].column = HVar7;
          begin._M_current[uVar11 + 1].boundtype = HVar6;
        }
        else if (begin._M_current[uVar11 + 1].column <= pHVar17->column) {
          if (((int)begin._M_current[uVar11 + 1].boundtype < (int)pHVar17->boundtype) ||
             (((int)begin._M_current[uVar11 + 1].boundtype <= (int)pHVar17->boundtype &&
              (pHVar13->boundval <= pHVar17->boundval && pHVar17->boundval != pHVar13->boundval))))
          goto LAB_002aa925;
        }
        if (pHVar17->column < begin._M_current[uVar11 - 1].column) {
LAB_002aa94d:
          dVar1 = pHVar20->boundval;
          HVar7 = begin._M_current[uVar11 - 1].column;
          HVar6 = begin._M_current[uVar11 - 1].boundtype;
          HVar5 = pHVar17->column;
          HVar3 = pHVar17->boundtype;
          pHVar20->boundval = pHVar17->boundval;
          begin._M_current[uVar11 - 1].column = HVar5;
          begin._M_current[uVar11 - 1].boundtype = HVar3;
          pHVar17->boundval = dVar1;
          pHVar17->column = HVar7;
          pHVar17->boundtype = HVar6;
        }
        else if (pHVar17->column <= begin._M_current[uVar11 - 1].column) {
          if (((int)pHVar17->boundtype < (int)begin._M_current[uVar11 - 1].boundtype) ||
             (((int)pHVar17->boundtype <= (int)begin._M_current[uVar11 - 1].boundtype &&
              (pHVar17->boundval <= pHVar20->boundval && pHVar20->boundval != pHVar17->boundval))))
          goto LAB_002aa94d;
        }
        local_68 = (begin._M_current)->boundval;
        uStack_60._0_4_ = (begin._M_current)->column;
        uStack_60._4_4_ = (begin._M_current)->boundtype;
        HVar5 = pHVar17->column;
        HVar3 = pHVar17->boundtype;
        (begin._M_current)->boundval = pHVar17->boundval;
        (begin._M_current)->column = HVar5;
        (begin._M_current)->boundtype = HVar3;
        pHVar17->boundval = local_68;
        pHVar17->column = (undefined4)uStack_60;
        pHVar17->boundtype = uStack_60._4_4_;
      }
      if ((param_4 & 1) == 0) {
        if (begin._M_current[-1].column < (begin._M_current)->column) goto LAB_002aa99d;
        if (begin._M_current[-1].column <= (begin._M_current)->column) {
          if (((int)begin._M_current[-1].boundtype < (int)(begin._M_current)->boundtype) ||
             (((int)begin._M_current[-1].boundtype <= (int)(begin._M_current)->boundtype &&
              (begin._M_current[-1].boundval <= (begin._M_current)->boundval &&
               (begin._M_current)->boundval != begin._M_current[-1].boundval)))) goto LAB_002aa99d;
        }
        begin = partition_left<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                          (begin._M_current,end._M_current);
        begin._M_current = begin._M_current + 1;
        bVar8 = false;
      }
      else {
LAB_002aa99d:
        pVar23 = partition_right<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                           (begin._M_current,end._M_current);
        _Var10 = pVar23.first._M_current;
        uVar14 = (long)_Var10._M_current - (long)begin._M_current >> 4;
        pHVar17 = _Var10._M_current + 1;
        uVar11 = (long)end._M_current - (long)pHVar17 >> 4;
        if (((long)uVar14 < (long)(uVar12 >> 3)) || ((long)uVar11 < (long)(uVar12 >> 3))) {
          local_50 = local_50 + -1;
          if (local_50 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsDomainChange>>>
                      (begin,end,(_Iter_comp_iter<std::less<HighsDomainChange>_> *)&local_68);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsDomainChange>>>
                      (begin,end,(_Iter_comp_iter<std::less<HighsDomainChange>_> *)&local_68);
            local_50 = 0;
LAB_002aadf2:
            bVar8 = true;
            goto LAB_002aadf5;
          }
          if (0x17 < (long)uVar14) {
            uVar12 = uVar14 >> 2;
            dVar1 = (begin._M_current)->boundval;
            HVar7 = (begin._M_current)->column;
            HVar6 = (begin._M_current)->boundtype;
            pHVar19 = begin._M_current + uVar12;
            HVar5 = pHVar19->column;
            HVar3 = pHVar19->boundtype;
            (begin._M_current)->boundval = pHVar19->boundval;
            (begin._M_current)->column = HVar5;
            (begin._M_current)->boundtype = HVar3;
            pHVar19 = begin._M_current + uVar12;
            pHVar19->boundval = dVar1;
            pHVar19->column = HVar7;
            pHVar19->boundtype = HVar6;
            pHVar19 = _Var10._M_current + -uVar12;
            local_68 = _Var10._M_current[-1].boundval;
            uStack_60._0_4_ = _Var10._M_current[-1].column;
            uStack_60._4_4_ = _Var10._M_current[-1].boundtype;
            HVar5 = pHVar19->column;
            HVar3 = pHVar19->boundtype;
            _Var10._M_current[-1].boundval = pHVar19->boundval;
            _Var10._M_current[-1].column = HVar5;
            _Var10._M_current[-1].boundtype = HVar3;
            pHVar19->boundval = local_68;
            pHVar19->column = (undefined4)uStack_60;
            pHVar19->boundtype = uStack_60._4_4_;
            if (0x80 < (long)uVar14) {
              dVar1 = begin._M_current[1].boundval;
              HVar7 = begin._M_current[1].column;
              HVar6 = begin._M_current[1].boundtype;
              pHVar19 = begin._M_current + uVar12 + 1;
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              begin._M_current[1].boundval = pHVar19->boundval;
              begin._M_current[1].column = HVar5;
              begin._M_current[1].boundtype = HVar3;
              pHVar19 = begin._M_current + uVar12 + 1;
              pHVar19->boundval = dVar1;
              pHVar19->column = HVar7;
              pHVar19->boundtype = HVar6;
              dVar1 = begin._M_current[2].boundval;
              HVar7 = begin._M_current[2].column;
              HVar6 = begin._M_current[2].boundtype;
              pHVar19 = begin._M_current + uVar12 + 2;
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              begin._M_current[2].boundval = pHVar19->boundval;
              begin._M_current[2].column = HVar5;
              begin._M_current[2].boundtype = HVar3;
              pHVar19 = begin._M_current + uVar12 + 2;
              pHVar19->boundval = dVar1;
              pHVar19->column = HVar7;
              pHVar19->boundtype = HVar6;
              dVar1 = _Var10._M_current[-2].boundval;
              HVar7 = _Var10._M_current[-2].column;
              HVar6 = _Var10._M_current[-2].boundtype;
              pHVar19 = _Var10._M_current + ~uVar12;
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              _Var10._M_current[-2].boundval = pHVar19->boundval;
              _Var10._M_current[-2].column = HVar5;
              _Var10._M_current[-2].boundtype = HVar3;
              pHVar19 = _Var10._M_current + ~uVar12;
              pHVar19->boundval = dVar1;
              pHVar19->column = HVar7;
              pHVar19->boundtype = HVar6;
              local_68 = _Var10._M_current[-3].boundval;
              uStack_60._0_4_ = _Var10._M_current[-3].column;
              uStack_60._4_4_ = _Var10._M_current[-3].boundtype;
              pHVar19 = _Var10._M_current + (-2 - uVar12);
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              _Var10._M_current[-3].boundval = pHVar19->boundval;
              _Var10._M_current[-3].column = HVar5;
              _Var10._M_current[-3].boundtype = HVar3;
              pHVar19 = _Var10._M_current + (-2 - uVar12);
              pHVar19->boundval = local_68;
              pHVar19->column = (undefined4)uStack_60;
              pHVar19->boundtype = uStack_60._4_4_;
            }
          }
          if (0x17 < (long)uVar11) {
            uVar12 = uVar11 >> 2;
            dVar1 = pHVar17->boundval;
            HVar7 = _Var10._M_current[1].column;
            HVar6 = _Var10._M_current[1].boundtype;
            pHVar19 = _Var10._M_current + uVar12 + 1;
            HVar5 = pHVar19->column;
            HVar3 = pHVar19->boundtype;
            pHVar17->boundval = pHVar19->boundval;
            _Var10._M_current[1].column = HVar5;
            _Var10._M_current[1].boundtype = HVar3;
            pHVar19 = _Var10._M_current + uVar12 + 1;
            pHVar19->boundval = dVar1;
            pHVar19->column = HVar7;
            pHVar19->boundtype = HVar6;
            pHVar19 = end._M_current + -uVar12;
            local_68 = pHVar22->boundval;
            uStack_60._0_4_ = pHVar22->column;
            uStack_60._4_4_ = pHVar22->boundtype;
            HVar5 = pHVar19->column;
            HVar3 = pHVar19->boundtype;
            pHVar22->boundval = pHVar19->boundval;
            pHVar22->column = HVar5;
            pHVar22->boundtype = HVar3;
            pHVar19->boundval = local_68;
            pHVar19->column = (undefined4)uStack_60;
            pHVar19->boundtype = uStack_60._4_4_;
            if (0x80 < (long)uVar11) {
              dVar1 = _Var10._M_current[2].boundval;
              HVar7 = _Var10._M_current[2].column;
              HVar6 = _Var10._M_current[2].boundtype;
              pHVar19 = _Var10._M_current + uVar12 + 2;
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              _Var10._M_current[2].boundval = pHVar19->boundval;
              _Var10._M_current[2].column = HVar5;
              _Var10._M_current[2].boundtype = HVar3;
              pHVar19 = _Var10._M_current + uVar12 + 2;
              pHVar19->boundval = dVar1;
              pHVar19->column = HVar7;
              pHVar19->boundtype = HVar6;
              dVar1 = _Var10._M_current[3].boundval;
              HVar7 = _Var10._M_current[3].column;
              HVar6 = _Var10._M_current[3].boundtype;
              pHVar19 = _Var10._M_current + uVar12 + 3;
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              _Var10._M_current[3].boundval = pHVar19->boundval;
              _Var10._M_current[3].column = HVar5;
              _Var10._M_current[3].boundtype = HVar3;
              pHVar19 = _Var10._M_current + uVar12 + 3;
              pHVar19->boundval = dVar1;
              pHVar19->column = HVar7;
              pHVar19->boundtype = HVar6;
              dVar1 = local_40->boundval;
              HVar7 = local_40->column;
              HVar6 = local_40->boundtype;
              pHVar19 = end._M_current + ~uVar12;
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              local_40->boundval = pHVar19->boundval;
              local_40->column = HVar5;
              local_40->boundtype = HVar3;
              pHVar19 = end._M_current + ~uVar12;
              pHVar19->boundval = dVar1;
              pHVar19->column = HVar7;
              pHVar19->boundtype = HVar6;
              local_68 = local_48->boundval;
              uStack_60._0_4_ = local_48->column;
              uStack_60._4_4_ = local_48->boundtype;
              pHVar19 = end._M_current + (-2 - uVar12);
              HVar5 = pHVar19->column;
              HVar3 = pHVar19->boundtype;
              local_48->boundval = pHVar19->boundval;
              local_48->column = HVar5;
              local_48->boundtype = HVar3;
              pHVar19 = end._M_current + (-2 - uVar12);
              pHVar19->boundval = local_68;
              pHVar19->column = (undefined4)uStack_60;
              pHVar19->boundtype = uStack_60._4_4_;
            }
          }
        }
        else if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_4c = param_4;
          if (begin._M_current == _Var10._M_current) {
LAB_002aacbe:
            if (pHVar17 == end._M_current) goto LAB_002aadf2;
            lVar9 = 0x10;
            lVar21 = 0;
            uVar12 = 0;
            do {
              pHVar19 = (HighsDomainChange *)((long)&_Var10._M_current[1].boundval + lVar9);
              pHVar22 = local_38;
              if (pHVar19 == end._M_current) goto LAB_002aa5e0;
              pHVar20 = (HighsDomainChange *)((long)&(_Var10._M_current)->boundval + lVar9);
              iVar2 = pHVar20[1].column;
              if (iVar2 < pHVar20->column) {
LAB_002aacf4:
                dVar1 = pHVar19->boundval;
                HVar3 = pHVar20[1].boundtype;
                uVar4 = *(undefined8 *)&pHVar20->column;
                pHVar19->boundval = pHVar20->boundval;
                *(undefined8 *)((long)&_Var10._M_current[1].column + lVar9) = uVar4;
                pHVar13 = pHVar19;
                lVar16 = lVar21;
                if (lVar9 != 0x10) {
                  do {
                    pHVar18 = pHVar20 + -1;
                    if (pHVar20[-1].column <= iVar2) {
                      if (pHVar20[-1].column < iVar2) {
                        pHVar13 = pHVar20 + 1;
                        break;
                      }
                      if (((int)pHVar20[-1].boundtype <= (int)HVar3) &&
                         (((int)pHVar20[-1].boundtype < (int)HVar3 || (pHVar18->boundval <= dVar1)))
                         ) break;
                    }
                    HVar5 = pHVar20[-1].column;
                    HVar6 = pHVar20[-1].boundtype;
                    pHVar20->boundval = pHVar18->boundval;
                    pHVar20->column = HVar5;
                    pHVar20->boundtype = HVar6;
                    lVar16 = lVar16 + 0x10;
                    pHVar13 = pHVar20;
                    pHVar20 = pHVar18;
                  } while (lVar16 != 0);
                }
                pHVar20->boundval = dVar1;
                pHVar13[-1].column = iVar2;
                pHVar13[-1].boundtype = HVar3;
                uVar12 = uVar12 + ((long)pHVar19 - (long)pHVar20 >> 4);
              }
              else if (iVar2 <= pHVar20->column) {
                if (((int)pHVar20[1].boundtype < (int)pHVar20->boundtype) ||
                   (((int)pHVar20[1].boundtype <= (int)pHVar20->boundtype &&
                    (pHVar19->boundval <= pHVar20->boundval &&
                     pHVar20->boundval != pHVar19->boundval)))) goto LAB_002aacf4;
              }
              lVar9 = lVar9 + 0x10;
              lVar21 = lVar21 + -0x10;
            } while (uVar12 < 9);
          }
          else {
            lVar9 = 0;
            uVar12 = 0;
            _Var15._M_current = begin._M_current;
            do {
              pHVar19 = _Var15._M_current + 1;
              if (pHVar19 == _Var10._M_current) goto LAB_002aacbe;
              iVar2 = _Var15._M_current[1].column;
              if (iVar2 < (_Var15._M_current)->column) {
LAB_002aaa10:
                dVar1 = _Var15._M_current[1].boundval;
                HVar3 = _Var15._M_current[1].boundtype;
                HVar5 = (_Var15._M_current)->column;
                HVar6 = (_Var15._M_current)->boundtype;
                pHVar19->boundval = (_Var15._M_current)->boundval;
                _Var15._M_current[1].column = HVar5;
                _Var15._M_current[1].boundtype = HVar6;
                lVar21 = lVar9;
                pHVar20 = pHVar19;
                if (_Var15._M_current != begin._M_current) {
                  do {
                    pHVar13 = _Var15._M_current;
                    pHVar18 = pHVar13 + -1;
                    if (pHVar13[-1].column <= iVar2) {
                      _Var15._M_current = pHVar13;
                      if (pHVar13[-1].column < iVar2) {
                        pHVar20 = pHVar13 + 1;
                        break;
                      }
                      if (((int)pHVar13[-1].boundtype <= (int)HVar3) &&
                         (((int)pHVar13[-1].boundtype < (int)HVar3 || (pHVar18->boundval <= dVar1)))
                         ) break;
                    }
                    HVar5 = pHVar13[-1].column;
                    HVar6 = pHVar13[-1].boundtype;
                    pHVar13->boundval = pHVar18->boundval;
                    pHVar13->column = HVar5;
                    pHVar13->boundtype = HVar6;
                    lVar21 = lVar21 + 0x10;
                    _Var15._M_current = pHVar18;
                    pHVar20 = pHVar13;
                  } while (lVar21 != 0);
                }
                (_Var15._M_current)->boundval = dVar1;
                pHVar20[-1].column = iVar2;
                pHVar20[-1].boundtype = HVar3;
                uVar12 = uVar12 + ((long)pHVar19 - (long)_Var15._M_current >> 4);
              }
              else if (iVar2 <= (_Var15._M_current)->column) {
                if (((int)_Var15._M_current[1].boundtype < (int)(_Var15._M_current)->boundtype) ||
                   (((int)_Var15._M_current[1].boundtype <= (int)(_Var15._M_current)->boundtype &&
                    (_Var15._M_current[1].boundval <= (_Var15._M_current)->boundval &&
                     (_Var15._M_current)->boundval != _Var15._M_current[1].boundval))))
                goto LAB_002aaa10;
              }
              lVar9 = lVar9 + -0x10;
              _Var15._M_current = pHVar19;
            } while (uVar12 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
                  (begin._M_current,_Var10._M_current,local_50);
        bVar8 = false;
        param_4 = 0;
        begin._M_current = pHVar17;
      }
    }
LAB_002aadf5:
    if (bVar8) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }